

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O3

ssize_t __thiscall Zip::read(Zip *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  runtime_error *prVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  int *in_R9;
  vector<char,_std::allocator<char>_> in;
  char local_cc [4];
  vector<char,_std::allocator<char>_> local_c8;
  string local_b0;
  pointer local_90;
  int local_88;
  basic_istream<char,_std::char_traits<char>_> *local_78;
  int local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  (this->is_)._M_t.
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_istream<char,_std::char_traits<char>_> *)0x0;
  (this->eocd_).signature[0] = '\0';
  (this->eocd_).signature[1] = '\0';
  (this->eocd_).signature[2] = '\0';
  (this->eocd_).signature[3] = '\0';
  (this->eocd_).diskNumber = 0;
  (this->eocd_).centralDirectoryDiskNumber = 0;
  (this->eocd_).numEntriesThisDisk = 0;
  (this->eocd_).numEntries = 0;
  (this->eocd_).centralDirectorySize = 0;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)this,(ulong)*(uint *)((long)puVar3 + 0x36));
  if (*(short *)(puVar3 + 5) == 8) {
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<char,_std::allocator<char>_>::resize
              (&local_c8,(ulong)*(uint *)((long)puVar3 + 0x32));
    std::istream::read((char *)*puVar3,
                       (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    local_50 = 0;
    uStack_48 = 0;
    local_40 = 0;
    iVar1 = inflateInit2_(&local_90,0xfffffff1,"1.2.11",0x70);
    if (iVar1 != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_cc[0] = 'r';
      local_cc[1] = '\0';
      local_cc[2] = '\0';
      local_cc[3] = '\0';
      util::str<char[34],char[85],char[2],int>
                (&local_b0,(util *)"Assertion `rv == Z_OK` failed at ",
                 (char (*) [34])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lib/zip.cc"
                 ,(char (*) [85])0x1afe61,(char (*) [2])local_cc,in_R9);
      std::runtime_error::runtime_error(prVar2,(string *)&local_b0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_88 = (int)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
               (int)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    local_90 = local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_78 = (this->is_)._M_t.
               super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl;
    local_70 = *(int *)(this->eocd_).signature - (int)local_78;
    iVar1 = inflate(&local_90,4);
    if (iVar1 != 1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_cc[0] = 'z';
      local_cc[1] = '\0';
      local_cc[2] = '\0';
      local_cc[3] = '\0';
      util::str<char[42],char[85],char[2],int>
                (&local_b0,(util *)"Assertion `rv == Z_STREAM_END` failed at ",
                 (char (*) [42])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lib/zip.cc"
                 ,(char (*) [85])0x1afe61,(char (*) [2])local_cc,in_R9);
      std::runtime_error::runtime_error(prVar2,(string *)&local_b0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_70 != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_cc[0] = '{';
      local_cc[1] = '\0';
      local_cc[2] = '\0';
      local_cc[3] = '\0';
      util::str<char[40],char[85],char[2],int>
                (&local_b0,(util *)"Assertion `z.avail_out == 0` failed at ",
                 (char (*) [40])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lib/zip.cc"
                 ,(char (*) [85])0x1afe61,(char (*) [2])local_cc,in_R9);
      std::runtime_error::runtime_error(prVar2,(string *)&local_b0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    inflateEnd(&local_90);
    if (local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    if (*(short *)(puVar3 + 5) != 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Unknown compression method");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::read((char *)*puVar3,
                       (long)(this->is_)._M_t.
                             super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl);
  }
  return (ssize_t)this;
}

Assistant:

std::vector<char> Zip::read() const {
  std::vector<char> out;

  // Decompress in memory
  out.resize(cdfh_.uncompressedSize);

  // Store
  if (cdfh_.compressionMethod == 0) {
    is_->read(out.data(), out.size());
    return out;
  }

  // Deflate
  if (cdfh_.compressionMethod == 8) {
    std::vector<char> in;
    int rv;

    // Read uncompressed data
    in.resize(cdfh_.compressedSize);
    is_->read(in.data(), in.size());

    // Initialize zlib
    z_stream z;
    z.zalloc = nullptr;
    z.zfree = nullptr;
    z.opaque = nullptr;

    // Use negative window bits to indicate raw data
    rv = inflateInit2(&z, -MAX_WBITS);
    ASSERT(rv == Z_OK);

    // Inflate entire file
    z.avail_in = in.size();
    z.next_in = (unsigned char*) in.data();
    z.avail_out = out.size();
    z.next_out = (unsigned char*) out.data();
    rv = inflate(&z, Z_FINISH);
    ASSERT(rv == Z_STREAM_END);
    ASSERT(z.avail_out == 0);

    // Finalize
    inflateEnd(&z);
    return out;
  }

  throw std::runtime_error("Unknown compression method");
}